

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall matchit::impl::Id<bool>::hasValue(Id<bool> *this)

{
  bool bVar1;
  IdBlock<bool> *pIVar2;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1321:44)>
  local_2;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1179:45)>
  local_1;
  
  pIVar2 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<bool>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>_&>
             ::_S_vtable._M_arr
             [*(__index_type *)
               ((long)&(this->mBlock).
                       super__Variant_base<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                       .
                       super__Move_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                       .
                       super__Copy_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                       .
                       super__Move_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                       .
                       super__Copy_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                       .
                       super__Variant_storage_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               + 0x18)]._M_data)(&local_2,&this->mBlock);
  bVar1 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1173:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1175:45),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1179:45)>_&&,_const_std::variant<std::monostate,_bool,_bool_*,_const_bool_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar2->super_IdBlockBase<bool>).mVariant.
                      super__Variant_base<std::monostate,_bool,_bool_*,_const_bool_*>.
                      super__Move_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
                      super__Copy_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*> + 8)].
            _M_data)(&local_1,&(pIVar2->super_IdBlockBase<bool>).mVariant);
  return bVar1;
}

Assistant:

constexpr bool hasValue() const { return block().hasValue(); }